

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

void __thiscall
cnn::SimpleRNNBuilder::start_new_sequence_impl
          (SimpleRNNBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *h_0)

{
  size_type sVar1;
  long in_RDI;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_00000088;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_00000090;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           *)0x66dc40);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     (in_RDI + 0x70));
  if ((sVar1 != 0) &&
     (sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                        ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         (in_RDI + 0x70)), sVar1 != *(uint *)(in_RDI + 0x88))) {
    __assert_fail("h0.size() == layers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                  ,0x3f,
                  "virtual void cnn::SimpleRNNBuilder::start_new_sequence_impl(const vector<Expression> &)"
                 );
  }
  return;
}

Assistant:

void SimpleRNNBuilder::start_new_sequence_impl(const vector<Expression>& h_0) {
  h.clear();
  h0 = h_0;
  if (h0.size()) { assert(h0.size() == layers); }
}